

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O2

ostream * tchecker::graph::dot_output_attributes
                    (ostream *os,
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *attr)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  std::operator<<(os,"[");
  for (p_Var2 = (attr->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(attr->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    if (p_Var2 != (attr->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
      std::operator<<(os,", ");
    }
    poVar1 = std::operator<<(os,(string *)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1,"=\"");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 2));
    std::operator<<(poVar1,"\"");
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

static std::ostream & dot_output_attributes(std::ostream & os, std::map<std::string, std::string> const & attr)
{
  os << "[";
  for (auto it = attr.begin(); it != attr.end(); ++it) {
    if (it != attr.begin())
      os << ", ";
    auto && [key, value] = *it;
    os << key << "=\"" << value << "\"";
  }
  os << "]";
  return os;
}